

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O2

ostream * opts::operator<<(ostream *out,Options *ops)

{
  _List_node_base *p_Var1;
  int iVar2;
  int max_long;
  const_iterator __end2;
  list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  *plVar3;
  
  plVar3 = &ops->options;
  p_Var1 = (_List_node_base *)plVar3;
  max_long = 0;
  while (p_Var1 = (((_List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)plVar3) {
    iVar2 = *(int *)((long)p_Var1[1]._M_next + 0x58) + *(int *)((long)p_Var1[1]._M_next + 0x18) + 1;
    if (max_long <= iVar2) {
      max_long = iVar2;
    }
  }
  std::operator<<((ostream *)out,"Options:\n");
  p_Var1 = (_List_node_base *)plVar3;
  while (p_Var1 = (((_List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)plVar3) {
    BasicOption::output((BasicOption *)p_Var1[1]._M_next,out,max_long);
  }
  return out;
}

Assistant:

std::ostream&
    operator<<(std::ostream& out, const Options& ops)
    {
        int max_long = 0;
        for (auto& cur : ops.options)
        {
            int cur_long = cur->long_size();
            if (cur_long > max_long)
                max_long = cur_long;
        }

        out << "Options:\n";
        for (auto& cur : ops.options)
            cur->output(out, max_long);

        return out;
    }